

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBLookupTables.cpp
# Opt level: O3

char * GetCDCDescriptorSubtypeName(U8 subtype)

{
  if (subtype < 0x11) {
    return &DAT_0013cec4 + *(int *)(&DAT_0013cec4 + (ulong)subtype * 4);
  }
  return "<unknown>";
}

Assistant:

const char* GetCDCDescriptorSubtypeName( U8 subtype )
{
    const char* Names[] = {
        "Header Functional Descriptor",
        "Call Management Functional Descriptor",
        "Abstract Control Management Functional Descriptor",
        "Direct Line Management Functional Descriptor",
        "Telephone Ringer Functional Descriptor",
        "Telephone Call and Line State Reporting Capabilities Functional Descriptor",
        "Union Functional descriptor",
        "Country Selection Functional Descriptor",
        "Telephone Operational Modes Functional Descriptor",
        "USB Terminal Functional Descriptor",
        "Network Channel Terminal Descriptor",
        "Protocol Unit Functional Descriptor",
        "Extension Unit Functional Descriptor",
        "Multi-Channel Management Functional Descriptor",
        "CAPI Control Management Functional Descriptor",
        "Ethernet Networking Functional Descriptor",
        "ATM Networking Functional Descriptor",
    };

    if( subtype < sizeof( Names ) / sizeof( *Names ) )
        return Names[ subtype ];

    return "<unknown>";
}